

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QREncoder.cpp
# Opt level: O3

Version * ZXing::QRCode::ChooseVersion(int numInputBits,ErrorCorrectionLevel ecLevel)

{
  int iVar1;
  Version *pVVar2;
  invalid_argument *this;
  int number;
  
  iVar1 = numInputBits + 0xe;
  if (-1 < numInputBits + 7) {
    iVar1 = numInputBits + 7;
  }
  number = 1;
  do {
    pVVar2 = Version::Model2(number);
    if (iVar1 >> 3 <=
        pVVar2->_totalCodewords -
        ((pVVar2->_ecBlocks)._M_elems[(int)ecLevel].blocks._M_elems[1].count +
        (pVVar2->_ecBlocks)._M_elems[(int)ecLevel].blocks._M_elems[0].count) *
        (pVVar2->_ecBlocks)._M_elems[(int)ecLevel].codewordsPerBlock) {
      return pVVar2;
    }
    number = number + 1;
  } while (number != 0x29);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Data too big");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static const Version& ChooseVersion(int numInputBits, ErrorCorrectionLevel ecLevel)
{
	for (int versionNum = 1; versionNum <= 40; versionNum++) {
		const Version* version = Version::Model2(versionNum);
		if (WillFit(numInputBits, *version, ecLevel)) {
			return *version;
		}
	}
	throw std::invalid_argument("Data too big");
}